

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_BadInput_Test::~ObserverManager_BadInput_Test(ObserverManager_BadInput_Test *this)

{
  ObserverManager_BadInput_Test *this_local;
  
  ~ObserverManager_BadInput_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, BadInput) {
    std::stringstream out;
    
    A* aBad = nullptr;
    ObserverManager::subscribe<FooBarProtocol>(aBad);
    
    B* bBad = nullptr;
    ObserverManager::unsubscribe<FooBarProtocol>(bBad);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Bad");
    
    EXPECT_EQ("", out.str());
}